

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

void NscPushAssignment(CNscPStackEntry *pOut,NscPCode nCode,NscType nType,CNscPStackEntry *pLhs,
                      CNscPStackEntry *pRhs)

{
  bool bVar1;
  UINT32 ulFlags;
  uchar *pauchData;
  size_t nSymbol;
  CNscPStackEntry *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  CNscPStackEntry *in_R8;
  NscPCodeVariable *pv;
  undefined4 in_stack_ffffffffffffff68;
  NscType in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff74;
  NscType in_stack_ffffffffffffff90;
  NscType in_stack_ffffffffffffff94;
  int nElement;
  int in_stack_ffffffffffffffb8;
  uchar *puVar2;
  
  bVar1 = CNscPStackEntry::IsSimpleVariable((CNscPStackEntry *)0x1fc37d);
  if (bVar1) {
    bVar1 = CNscContext::GetWarnOnAssignRHSIsAssignment(g_pCtx);
    if ((bVar1) &&
       (bVar1 = CNscPStackEntry::IsAssignment
                          ((CNscPStackEntry *)
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)), bVar1)) {
      CNscContext::GenerateMessage(g_pCtx,NscMessage_WarningNestedRHSAssign);
    }
    pauchData = CNscPStackEntry::GetData(in_RCX);
    CNscPStackEntry::GetType(in_R8);
    nElement = (int)*(undefined8 *)(pauchData + 0x18);
    uVar3 = *(undefined4 *)(pauchData + 0x24);
    puVar2 = CNscPStackEntry::GetData(in_R8);
    ulFlags = (UINT32)puVar2;
    nSymbol = CNscPStackEntry::GetDataSize(in_R8);
    CNscPStackEntry::PushAssignment
              ((CNscPStackEntry *)CONCAT44(in_EDX,in_ESI),(NscPCode)((ulong)in_RDI >> 0x20),
               (NscType)in_RDI,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,nSymbol,nElement,
               in_stack_ffffffffffffffb8,ulFlags,pauchData,(size_t)in_R8);
    CNscPStackEntry::SetType
              ((CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff74,uVar3),
               in_stack_ffffffffffffff6c);
  }
  else {
    CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorAssignLHSNotVariable);
    CNscPStackEntry::SetType
              ((CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c);
  }
  return;
}

Assistant:

void NscPushAssignment (CNscPStackEntry *pOut, NscPCode nCode,
	NscType nType, CNscPStackEntry *pLhs, CNscPStackEntry *pRhs)
{

	//
	// Validate 
	//

	if (!pLhs ->IsSimpleVariable ())
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorAssignLHSNotVariable);
		pOut ->SetType (NscType_Error);
		return;
	}

	//
	// If we are detecting the standard compiler's parser limitation with
	// nested assignments
	//

	if (g_pCtx ->GetWarnOnAssignRHSIsAssignment () && pRhs ->IsAssignment ())
		g_pCtx ->GenerateMessage (NscMessage_WarningNestedRHSAssign);

	//
	// Create the pcode
	//

	NscPCodeVariable *pv = (NscPCodeVariable *) pLhs ->GetData ();
	pOut ->PushAssignment (nCode, nType, pv ->nSourceType, pRhs ->GetType (),
		pv ->nSymbol, pv ->nElement, pv ->nStackOffset, pv ->ulFlags, 
		pRhs ->GetData (), pRhs ->GetDataSize ());
	pOut ->SetType (nType);
	return;
}